

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowpassSpeaker.hpp
# Opt level: O2

void __thiscall
Outputs::Speaker::PullLowpass<Enterprise::Dave::Audio>::PullLowpass
          (PullLowpass<Enterprise::Dave::Audio> *this,Audio *sample_source)

{
  LowpassBase<Outputs::Speaker::PullLowpass<Enterprise::Dave::Audio>,_true>::LowpassBase
            (&this->super_LowpassBase<Outputs::Speaker::PullLowpass<Enterprise::Dave::Audio>,_true>)
  ;
  (this->super_LowpassBase<Outputs::Speaker::PullLowpass<Enterprise::Dave::Audio>,_true>).
  super_Speaker._vptr_Speaker = (_func_int **)&PTR__LowpassBase_00584ed8;
  this->sample_source_ = sample_source;
  Enterprise::Dave::Audio::set_sample_volume_range(sample_source,0x7fff);
  return;
}

Assistant:

PullLowpass(SampleSource &sample_source) : sample_source_(sample_source) {
			// Propagate an initial volume level.
			sample_source.set_sample_volume_range(32767);
		}